

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Light_EvalRes * embree::Lights_eval(Light *self,DifferentialGeometry *dg,Vec3fa *dir)

{
  Vec3fa *dir_00;
  Light *in_RCX;
  uint *in_RSI;
  Light_EvalRes *in_RDI;
  float fVar1;
  TutorialLightType ty;
  Light_EvalRes *res;
  DifferentialGeometry *in_stack_ffffffffffffff68;
  Light *in_stack_ffffffffffffff70;
  Vec3fa *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  Vec3fa *in_stack_ffffffffffffffd8;
  DifferentialGeometry *in_stack_ffffffffffffffe0;
  Vec3fa *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  dir_00 = (Vec3fa *)(ulong)*in_RSI;
  switch(dir_00) {
  case (Vec3fa *)0x0:
    AmbientLight_eval(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,dir_00);
    break;
  case (Vec3fa *)0x1:
    PointLight_eval((Light *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffd8);
    break;
  case (Vec3fa *)0x2:
    DirectionalLight_eval
              (in_RCX,(DifferentialGeometry *)CONCAT44(*in_RSI,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    break;
  case (Vec3fa *)0x3:
    SpotLight_eval((Light *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (DifferentialGeometry *)
                   CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffe8);
    break;
  default:
    Light_EvalRes::Light_EvalRes(in_RDI);
    *(undefined8 *)&(in_RDI->value).field_0 = 0;
    *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = 0;
    fVar1 = std::numeric_limits<float>::infinity();
    in_RDI->dist = fVar1;
    in_RDI->pdf = 0.0;
    break;
  case (Vec3fa *)0x6:
    QuadLight_eval(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,dir_00);
  }
  return in_RDI;
}

Assistant:

Light_EvalRes Lights_eval(const Light* self,
                          const DifferentialGeometry& dg,
                          const Vec3fa& dir)
{
  TutorialLightType ty = self->type;
  switch (ty) {
  case LIGHT_AMBIENT     : return AmbientLight_eval(self,dg,dir);
  case LIGHT_POINT       : return PointLight_eval(self,dg,dir);
  case LIGHT_DIRECTIONAL : return DirectionalLight_eval(self,dg,dir);
  case LIGHT_SPOT        : return SpotLight_eval(self,dg,dir);
  case LIGHT_QUAD        : return QuadLight_eval(self,dg,dir);
  default: {
    Light_EvalRes res;
    res.value = Vec3fa(0,0,0);
    res.dist = inf;
    res.pdf = 0.f;
    return res;
  }
  }
}